

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O0

int archive_compressor_zstd_open(archive_write_filter *f)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  void *pvVar6;
  size_t bpb;
  size_t bs;
  private_data_conflict8 *data;
  archive_write_filter *f_local;
  
  piVar1 = (int *)f->data;
  if (*(long *)(piVar1 + 0x14) == 0) {
    sVar4 = ZSTD_CStreamOutSize();
    bpb = sVar4;
    if (f->archive->magic == 0xb0c5c0de) {
      iVar2 = archive_write_get_bytes_per_block(f->archive);
      uVar5 = (ulong)iVar2;
      bpb = uVar5;
      if ((uVar5 <= sVar4) && (bpb = sVar4, uVar5 != 0)) {
        bpb = sVar4 - sVar4 % uVar5;
      }
    }
    *(size_t *)(piVar1 + 0x16) = bpb;
    piVar1[0x18] = 0;
    piVar1[0x19] = 0;
    pvVar6 = malloc(*(size_t *)(piVar1 + 0x16));
    *(void **)(piVar1 + 0x14) = pvVar6;
    if (*(long *)(piVar1 + 0x14) == 0) {
      archive_set_error(f->archive,0xc,"Can\'t allocate data for compression buffer");
      return -0x1e;
    }
  }
  f->write = archive_compressor_zstd_write;
  sVar4 = ZSTD_initCStream(*(ZSTD_CStream **)(piVar1 + 0x12),*piVar1);
  uVar3 = ZSTD_isError(sVar4);
  if (uVar3 == 0) {
    ZSTD_CCtx_setParameter(*(ZSTD_CCtx **)(piVar1 + 0x12),ZSTD_c_nbWorkers,piVar1[1]);
    ZSTD_CCtx_setParameter(*(ZSTD_CCtx **)(piVar1 + 0x12),ZSTD_c_windowLog,piVar1[2]);
    f_local._4_4_ = 0;
  }
  else {
    archive_set_error(f->archive,-1,"Internal error initializing zstd compressor object");
    f_local._4_4_ = -0x1e;
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_zstd_open(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;

	if (data->out.dst == NULL) {
		size_t bs = ZSTD_CStreamOutSize(), bpb;
		if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
			/* Buffer size should be a multiple number of
			 * the of bytes per block for performance. */
			bpb = archive_write_get_bytes_per_block(f->archive);
			if (bpb > bs)
				bs = bpb;
			else if (bpb != 0)
				bs -= bs % bpb;
		}
		data->out.size = bs;
		data->out.pos = 0;
		data->out.dst
		    = (unsigned char *)malloc(data->out.size);
		if (data->out.dst == NULL) {
			archive_set_error(f->archive, ENOMEM,
			    "Can't allocate data for compression buffer");
			return (ARCHIVE_FATAL);
		}
	}

	f->write = archive_compressor_zstd_write;

	if (ZSTD_isError(ZSTD_initCStream(data->cstream,
	    data->compression_level))) {
		archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing zstd compressor object");
		return (ARCHIVE_FATAL);
	}

	ZSTD_CCtx_setParameter(data->cstream, ZSTD_c_nbWorkers, data->threads);

#if ZSTD_VERSION_NUMBER >= MINVER_LONG
	ZSTD_CCtx_setParameter(data->cstream, ZSTD_c_windowLog, data->long_distance);
#endif

	return (ARCHIVE_OK);
}